

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O2

void __thiscall
cbtAxisSweep3Internal<unsigned_short>::sortMaxUp
          (cbtAxisSweep3Internal<unsigned_short> *this,int axis,unsigned_short edge,
          cbtDispatcher *param_3,bool updateOverlaps)

{
  unsigned_short *puVar1;
  short *psVar2;
  ulong uVar3;
  ushort uVar4;
  ushort uVar5;
  Handle *pHVar6;
  Handle *pHVar7;
  cbtOverlappingPairCallback *pcVar8;
  long lVar9;
  uint axis0;
  long lVar10;
  undefined6 in_register_00000012;
  Handle *pHVar11;
  long lVar12;
  Handle *pHVar13;
  Edge *pEVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  
  lVar12 = (long)axis;
  pEVar14 = this->m_pEdges[lVar12] + (CONCAT62(in_register_00000012,edge) & 0xffffffff);
  uVar4 = pEVar14->m_handle;
  pHVar6 = this->m_pHandles;
  axis0 = 1 << (axis & 0x1fU) & 3;
  lVar9 = 0x34;
  for (; (uVar5 = pEVar14[1].m_handle, (ulong)uVar5 != 0 && (pEVar14[1].m_pos <= pEVar14->m_pos));
      pEVar14 = pEVar14 + 1) {
    pHVar7 = this->m_pHandles;
    bVar15 = (pEVar14[1].m_pos & 1) == 0;
    lVar10 = 0x3a;
    if (bVar15) {
      lVar10 = lVar9;
    }
    if (bVar15 && updateOverlaps) {
      bVar15 = testOverlap2D(this,pHVar6 + uVar4,pHVar7 + uVar5,axis0,1 << axis0 & 3);
      lVar10 = lVar9;
      if (bVar15) {
        pHVar13 = this->m_pHandles + pEVar14->m_handle;
        pHVar11 = this->m_pHandles + pEVar14[1].m_handle;
        (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback[2])
                  (this->m_pairCache,pHVar13,pHVar11);
        pcVar8 = this->m_userPairCallback;
        if (pcVar8 != (cbtOverlappingPairCallback *)0x0) {
          (*pcVar8->_vptr_cbtOverlappingPairCallback[2])(pcVar8,pHVar13,pHVar11);
        }
      }
    }
    psVar2 = (short *)((long)pHVar7[uVar5].super_cbtBroadphaseProxy.m_aabbMin.m_floats +
                      lVar12 * 2 + lVar10 + -0x14);
    *psVar2 = *psVar2 + -1;
    puVar1 = pHVar6[uVar4].m_maxEdges + lVar12;
    *puVar1 = *puVar1 + 1;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = *(ulong *)pEVar14;
    auVar16 = vshufps_avx(auVar16,auVar16,0xe1);
    uVar3 = vmovlps_avx(auVar16);
    *(ulong *)pEVar14 = uVar3;
  }
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::sortMaxUp(int axis, BP_FP_INT_TYPE edge, cbtDispatcher* /* dispatcher */, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pNext = pEdge + 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pNext->m_handle && (pEdge->m_pos >= pNext->m_pos))
	{
		Handle* pHandleNext = getHandle(pNext->m_handle);

		const int axis1 = (1 << axis) & 3;
		const int axis2 = (1 << axis1) & 3;

		if (!pNext->IsMax())
		{
			// if next edge is a minimum check the bounds and add an overlap if necessary
			if (updateOverlaps && testOverlap2D(pHandleEdge, pHandleNext, axis1, axis2))
			{
				Handle* handle0 = getHandle(pEdge->m_handle);
				Handle* handle1 = getHandle(pNext->m_handle);
				m_pairCache->addOverlappingPair(handle0, handle1);
				if (m_userPairCallback)
					m_userPairCallback->addOverlappingPair(handle0, handle1);
			}

			// update edge reference in other handle
			pHandleNext->m_minEdges[axis]--;
		}
		else
			pHandleNext->m_maxEdges[axis]--;

		pHandleEdge->m_maxEdges[axis]++;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pNext;
		*pNext = swap;

		// increment
		pEdge++;
		pNext++;
	}
}